

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_tt__active_edge * nk_tt__new_active(nk_tt__hheap *hh,nk_tt__edge *e,int off_x,float start_point)

{
  nk_tt__active_edge *pnVar1;
  float fVar2;
  float local_3c;
  float local_38;
  float dxdy;
  nk_tt__active_edge *z;
  float start_point_local;
  int off_x_local;
  nk_tt__edge *e_local;
  nk_tt__hheap *hh_local;
  
  pnVar1 = (nk_tt__active_edge *)nk_tt__hheap_alloc(hh,0x20);
  fVar2 = (e->x1 - e->x0) / (e->y1 - e->y0);
  if (pnVar1 != (nk_tt__active_edge *)0x0) {
    pnVar1->fdx = fVar2;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_38 = 1.0 / fVar2;
    }
    else {
      local_38 = 0.0;
    }
    pnVar1->fdy = local_38;
    pnVar1->fx = fVar2 * (start_point - e->y0) + e->x0;
    pnVar1->fx = pnVar1->fx - (float)off_x;
    local_3c = 1.0;
    if (e->invert == 0) {
      local_3c = -1.0;
    }
    pnVar1->direction = local_3c;
    pnVar1->sy = e->y0;
    pnVar1->ey = e->y1;
    pnVar1->next = (nk_tt__active_edge *)0x0;
  }
  return pnVar1;
}

Assistant:

NK_INTERN struct nk_tt__active_edge*
nk_tt__new_active(struct nk_tt__hheap *hh, struct nk_tt__edge *e,
    int off_x, float start_point)
{
    struct nk_tt__active_edge *z = (struct nk_tt__active_edge *)
        nk_tt__hheap_alloc(hh, sizeof(*z));
    float dxdy = (e->x1 - e->x0) / (e->y1 - e->y0);
    /*STBTT_assert(e->y0 <= start_point); */
    if (!z) return z;
    z->fdx = dxdy;
    z->fdy = (dxdy != 0) ? (1/dxdy): 0;
    z->fx = e->x0 + dxdy * (start_point - e->y0);
    z->fx -= (float)off_x;
    z->direction = e->invert ? 1.0f : -1.0f;
    z->sy = e->y0;
    z->ey = e->y1;
    z->next = 0;
    return z;
}